

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::get_inner_entry_point_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this)

{
  ExecutionModel EVar1;
  SPIREntryPoint *pSVar2;
  CompilerError *this_00;
  char (*in_RCX) [7];
  char *pcVar3;
  string *name;
  char *pcVar4;
  
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  if ((this->hlsl_options).use_entry_point_name == true) {
    join<std::__cxx11::string_const&,char_const(&)[7]>
              (__return_storage_ptr__,(spirv_cross *)&pSVar2->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_inner",in_RCX)
    ;
    ParsedIR::sanitize_underscores(__return_storage_ptr__);
  }
  else {
    EVar1 = pSVar2->model;
    if ((int)EVar1 < 5) {
      if (EVar1 == ExecutionModelVertex) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "vert_main";
        pcVar3 = "";
      }
      else {
        if (EVar1 != ExecutionModelFragment) {
LAB_001b0a8c:
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Unsupported execution model.");
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "frag_main";
        pcVar3 = "";
      }
    }
    else if (EVar1 == ExecutionModelGLCompute) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "comp_main";
      pcVar3 = "";
    }
    else if (EVar1 == ExecutionModelTaskEXT) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "task_main";
      pcVar3 = "";
    }
    else {
      if (EVar1 != ExecutionModelMeshEXT) goto LAB_001b0a8c;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "mesh_main";
      pcVar3 = "";
    }
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::get_inner_entry_point_name() const
{
	auto &execution = get_entry_point();

	if (hlsl_options.use_entry_point_name)
	{
		auto name = join(execution.name, "_inner");
		ParsedIR::sanitize_underscores(name);
		return name;
	}

	if (execution.model == ExecutionModelVertex)
		return "vert_main";
	else if (execution.model == ExecutionModelFragment)
		return "frag_main";
	else if (execution.model == ExecutionModelGLCompute)
		return "comp_main";
	else if (execution.model == ExecutionModelMeshEXT)
		return "mesh_main";
	else if (execution.model == ExecutionModelTaskEXT)
		return "task_main";
	else
		SPIRV_CROSS_THROW("Unsupported execution model.");
}